

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  uint32_t *puVar1;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint64_t uVar5;
  byte *pbVar6;
  uint32_t uVar7;
  int iVar8;
  size_t sVar9;
  uint32_t uVar10;
  HuffmanCode *pHVar11;
  HuffmanCode *pHVar12;
  ulong uVar13;
  HuffmanCode *table;
  uint64_t uVar14;
  uint uVar15;
  BrotliBitReader *br;
  bool bVar16;
  uint32_t block_type;
  uint32_t index;
  uint local_48;
  uint local_44;
  ulong local_40;
  uint8_t *local_38;
  
  br = &s->br;
  uVar5 = (s->br).val_;
  uVar3 = (s->br).bit_pos_;
  local_38 = (s->br).next_in;
  local_40 = (s->br).avail_in;
  bVar16 = uVar3 - 0x32 < 0xf;
  uVar10 = uVar3;
  if (bVar16) {
    sVar9 = (s->br).avail_in;
    uVar13 = local_40;
    if (sVar9 != 0) {
      uVar14 = (s->br).val_;
      pbVar6 = (s->br).next_in;
      uVar7 = uVar3;
      do {
        uVar10 = uVar7 - 8;
        sVar9 = sVar9 - 1;
        uVar13 = uVar14 >> 8;
        (s->br).val_ = uVar13;
        uVar14 = (ulong)*pbVar6 << 0x38 | uVar14 >> 8;
        (s->br).val_ = uVar14;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar9;
        (s->br).next_in = pbVar6 + 1;
        bVar16 = uVar7 - 0x3a < 0xf;
        if (!bVar16) goto LAB_00106026;
        pbVar6 = pbVar6 + 1;
        uVar7 = uVar10;
      } while (sVar9 != 0);
    }
  }
  else {
LAB_00106026:
    uVar13 = (ulong)((uint)(br->val_ >> ((byte)uVar10 & 0x3f)) & 0x7fff);
  }
  uVar4 = s->num_block_types[0];
  table = s->block_type_trees;
  pHVar12 = s->block_len_trees;
  if (bVar16) {
    iVar8 = SafeDecodeSymbol(table,br,&local_48);
    if (iVar8 == 0) {
      return 0;
    }
  }
  else {
    pHVar11 = table + (uVar13 & 0xff);
    bVar2 = pHVar11->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 + 8;
      pHVar11 = pHVar11 + (ulong)pHVar11->value +
                          (ulong)((uint)(uVar13 >> 8) & 0xffffff & kBitMask[bVar2 - 8]);
    }
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 + (uint)pHVar11->bits;
    local_48 = (uint)pHVar11->value;
  }
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    uVar10 = (s->br).bit_pos_;
    bVar16 = uVar10 - 0x32 < 0xf;
    if (bVar16) {
      sVar9 = (s->br).avail_in;
      if (sVar9 != 0) {
        uVar14 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        uVar7 = uVar10;
        do {
          uVar10 = uVar7 - 8;
          sVar9 = sVar9 - 1;
          table = (HuffmanCode *)(uVar14 >> 8);
          (s->br).val_ = (uint64_t)table;
          uVar14 = (ulong)*pbVar6 << 0x38 | uVar14 >> 8;
          (s->br).val_ = uVar14;
          (s->br).bit_pos_ = uVar10;
          (s->br).avail_in = sVar9;
          (s->br).next_in = pbVar6 + 1;
          bVar16 = uVar7 - 0x3a < 0xf;
          if (!bVar16) goto LAB_0010610e;
          pbVar6 = pbVar6 + 1;
          uVar7 = uVar10;
        } while (sVar9 != 0);
      }
    }
    else {
LAB_0010610e:
      table = (HuffmanCode *)(ulong)((uint)(br->val_ >> ((byte)uVar10 & 0x3f)) & 0x7fff);
    }
    if (bVar16) {
      iVar8 = SafeDecodeSymbol(pHVar12,br,&local_44);
      if (iVar8 == 0) goto LAB_00106234;
    }
    else {
      pHVar12 = pHVar12 + ((ulong)table & 0xff);
      bVar2 = pHVar12->bits;
      if (8 < bVar2) {
        puVar1 = &(s->br).bit_pos_;
        *puVar1 = *puVar1 + 8;
        pHVar12 = pHVar12 + (ulong)pHVar12->value +
                            (ulong)((uint)((ulong)table >> 8) & 0xffffff & kBitMask[bVar2 - 8]);
      }
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 + (uint)pHVar12->bits;
      local_44 = (uint)pHVar12->value;
    }
  }
  else {
    local_44 = s->block_length_index;
  }
  bVar2 = kBlockLengthPrefixCode[local_44].nbits;
  uVar10 = (s->br).bit_pos_;
  bVar16 = 0x40 - uVar10 < (uint)bVar2;
  if (bVar16) {
    sVar9 = (s->br).avail_in;
    if (sVar9 != 0) {
      uVar14 = (s->br).val_;
      uVar15 = 0x48 - uVar10;
      pbVar6 = (s->br).next_in;
      do {
        uVar10 = uVar10 - 8;
        sVar9 = sVar9 - 1;
        (s->br).val_ = uVar14 >> 8;
        uVar14 = (ulong)*pbVar6 << 0x38 | uVar14 >> 8;
        (s->br).val_ = uVar14;
        (s->br).bit_pos_ = uVar10;
        (s->br).avail_in = sVar9;
        (s->br).next_in = pbVar6 + 1;
        bVar16 = uVar15 < bVar2;
        if (!bVar16) goto LAB_001061eb;
        uVar15 = uVar15 + 8;
        pbVar6 = pbVar6 + 1;
      } while (sVar9 != 0);
    }
  }
  else {
LAB_001061eb:
    br = (BrotliBitReader *)
         (ulong)((uint)((s->br).val_ >> ((byte)uVar10 & 0x3f)) & kBitMask[(uint)bVar2]);
    (s->br).bit_pos_ = uVar10 + bVar2;
  }
  if (!bVar16) {
    s->block_length[0] = (int)br + (uint)kBlockLengthPrefixCode[local_44].offset;
  }
  else {
    s->block_length_index = local_44;
  }
  s->substate_read_block_length = (uint)bVar16;
  if (!bVar16) {
    if (local_48 == 0) {
      local_48 = s->block_type_rb[0];
    }
    else if (local_48 == 1) {
      local_48 = s->block_type_rb[1] + 1;
    }
    else {
      local_48 = local_48 - 2;
    }
    if (uVar4 <= local_48) {
      local_48 = local_48 - uVar4;
    }
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_48;
    s->context_map_slice = s->context_map + (local_48 << 6);
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_48 >> 5] >> (local_48 & 0x1f) & 1) != 0);
    s->literal_htree = (s->literal_hgroup).htrees[s->context_map[local_48 << 6]];
    bVar2 = s->context_modes[local_48];
    s->context_lookup1 = "" + kContextLookupOffsets[bVar2];
    s->context_lookup2 = "" + kContextLookupOffsets[(ulong)bVar2 + 1];
    return 1;
  }
LAB_00106234:
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  (s->br).val_ = uVar5;
  (s->br).bit_pos_ = uVar3;
  (s->br).next_in = local_38;
  (s->br).avail_in = local_40;
  return 0;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE SafeDecodeLiteralBlockSwitch(
    BrotliDecoderState* s) {
  return DecodeLiteralBlockSwitchInternal(1, s);
}